

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

void secp256k1_nonce_function_musig
               (secp256k1_scalar *k,uchar *session_secrand,uchar *msg32,uchar *seckey32,uchar *pk33,
               uchar *agg_pk32,uchar *extra_input32)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  secp256k1_sha256 *psVar9;
  secp256k1_sha256 *psVar10;
  byte bVar11;
  uchar rand [32];
  uchar buf [32];
  secp256k1_sha256 sha_tmp;
  uchar local_14a;
  uchar local_149;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  uchar local_128 [32];
  secp256k1_sha256 local_108;
  secp256k1_sha256 local_98;
  
  bVar11 = 0;
  if (seckey32 == (uchar *)0x0) {
    local_148 = *(undefined8 *)session_secrand;
    uStack_140 = *(undefined8 *)(session_secrand + 8);
    local_138 = *(undefined8 *)(session_secrand + 0x10);
    uStack_130 = *(undefined8 *)(session_secrand + 0x18);
  }
  else {
    local_98.s[0] = 0xa19e884b;
    local_98.s[1] = 0xf463fe7e;
    local_98.s[2] = 0x2f18f9a2;
    local_98.s[3] = 0xbeb0f9ff;
    local_98.s[4] = 0xf37e8b0;
    local_98.s[5] = 0x6ebd26f;
    local_98.s[6] = 0xe3b243d2;
    local_98.s[7] = 0x522fb150;
    local_98.bytes = 0x40;
    secp256k1_sha256_write(&local_98,session_secrand,0x20);
    secp256k1_sha256_finalize(&local_98,(uchar *)&local_148);
    lVar7 = 0;
    do {
      puVar1 = (uint *)(seckey32 + lVar7);
      uVar2 = puVar1[1];
      uVar3 = puVar1[2];
      uVar4 = puVar1[3];
      uVar5 = *(uint *)((long)&uStack_140 + lVar7);
      uVar6 = *(uint *)((long)&uStack_140 + lVar7 + 4);
      *(uint *)((long)&local_148 + lVar7) = *puVar1 ^ *(uint *)((long)&local_148 + lVar7);
      *(uint *)((long)&local_148 + lVar7 + 4) = uVar2 ^ *(uint *)((long)&local_148 + lVar7 + 4);
      *(uint *)((long)&uStack_140 + lVar7) = uVar3 ^ uVar5;
      *(uint *)((long)&uStack_140 + lVar7 + 4) = uVar4 ^ uVar6;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x20);
    local_14a = ' ';
  }
  local_98.s[0] = 0x7101b64;
  local_98.s[1] = 0x18003414;
  local_98.s[2] = 0x391bc43;
  local_98.s[3] = 0xe6258ee;
  local_98.s[4] = 0x29d26b72;
  local_98.s[5] = 0x8343937e;
  local_98.s[6] = 0xb7a0a4fb;
  local_98.s[7] = 0xff568a30;
  local_98.bytes = 0x40;
  secp256k1_sha256_write(&local_98,(uchar *)&local_148,0x20);
  secp256k1_nonce_function_musig_helper(&local_98,1,pk33,'!');
  secp256k1_nonce_function_musig_helper(&local_98,1,agg_pk32,' ');
  local_149 = msg32 != (uchar *)0x0;
  secp256k1_sha256_write(&local_98,&local_149,1);
  if (msg32 != (uchar *)0x0) {
    secp256k1_nonce_function_musig_helper(&local_98,8,msg32,' ');
  }
  secp256k1_nonce_function_musig_helper(&local_98,4,extra_input32,' ');
  local_14a = '\0';
  lVar7 = -1;
  do {
    psVar9 = &local_98;
    psVar10 = &local_108;
    for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
      *(undefined8 *)psVar10->s = *(undefined8 *)psVar9->s;
      psVar9 = (secp256k1_sha256 *)((long)psVar9 + (ulong)bVar11 * -0x10 + 8);
      psVar10 = (secp256k1_sha256 *)((long)psVar10 + (ulong)bVar11 * -0x10 + 8);
    }
    secp256k1_sha256_write(&local_108,&local_14a,1);
    secp256k1_sha256_finalize(&local_108,local_128);
    secp256k1_scalar_set_b32(k,local_128,(int *)0x0);
    local_128[0x10] = '\0';
    local_128[0x11] = '\0';
    local_128[0x12] = '\0';
    local_128[0x13] = '\0';
    local_128[0x14] = '\0';
    local_128[0x15] = '\0';
    local_128[0x16] = '\0';
    local_128[0x17] = '\0';
    local_128[0x18] = '\0';
    local_128[0x19] = '\0';
    local_128[0x1a] = '\0';
    local_128[0x1b] = '\0';
    local_128[0x1c] = '\0';
    local_128[0x1d] = '\0';
    local_128[0x1e] = '\0';
    local_128[0x1f] = '\0';
    local_128[0] = '\0';
    local_128[1] = '\0';
    local_128[2] = '\0';
    local_128[3] = '\0';
    local_128[4] = '\0';
    local_128[5] = '\0';
    local_128[6] = '\0';
    local_128[7] = '\0';
    local_128[8] = '\0';
    local_128[9] = '\0';
    local_128[10] = '\0';
    local_128[0xb] = '\0';
    local_128[0xc] = '\0';
    local_128[0xd] = '\0';
    local_128[0xe] = '\0';
    local_128[0xf] = '\0';
    local_108.buf[0x30] = '\0';
    local_108.buf[0x31] = '\0';
    local_108.buf[0x32] = '\0';
    local_108.buf[0x33] = '\0';
    local_108.buf[0x34] = '\0';
    local_108.buf[0x35] = '\0';
    local_108.buf[0x36] = '\0';
    local_108.buf[0x37] = '\0';
    local_108.buf[0x38] = '\0';
    local_108.buf[0x39] = '\0';
    local_108.buf[0x3a] = '\0';
    local_108.buf[0x3b] = '\0';
    local_108.buf[0x3c] = '\0';
    local_108.buf[0x3d] = '\0';
    local_108.buf[0x3e] = '\0';
    local_108.buf[0x3f] = '\0';
    local_108.buf[0x20] = '\0';
    local_108.buf[0x21] = '\0';
    local_108.buf[0x22] = '\0';
    local_108.buf[0x23] = '\0';
    local_108.buf[0x24] = '\0';
    local_108.buf[0x25] = '\0';
    local_108.buf[0x26] = '\0';
    local_108.buf[0x27] = '\0';
    local_108.buf[0x28] = '\0';
    local_108.buf[0x29] = '\0';
    local_108.buf[0x2a] = '\0';
    local_108.buf[0x2b] = '\0';
    local_108.buf[0x2c] = '\0';
    local_108.buf[0x2d] = '\0';
    local_108.buf[0x2e] = '\0';
    local_108.buf[0x2f] = '\0';
    local_108.buf[0x10] = '\0';
    local_108.buf[0x11] = '\0';
    local_108.buf[0x12] = '\0';
    local_108.buf[0x13] = '\0';
    local_108.buf[0x14] = '\0';
    local_108.buf[0x15] = '\0';
    local_108.buf[0x16] = '\0';
    local_108.buf[0x17] = '\0';
    local_108.buf[0x18] = '\0';
    local_108.buf[0x19] = '\0';
    local_108.buf[0x1a] = '\0';
    local_108.buf[0x1b] = '\0';
    local_108.buf[0x1c] = '\0';
    local_108.buf[0x1d] = '\0';
    local_108.buf[0x1e] = '\0';
    local_108.buf[0x1f] = '\0';
    local_108.buf[0] = '\0';
    local_108.buf[1] = '\0';
    local_108.buf[2] = '\0';
    local_108.buf[3] = '\0';
    local_108.buf[4] = '\0';
    local_108.buf[5] = '\0';
    local_108.buf[6] = '\0';
    local_108.buf[7] = '\0';
    local_108.buf[8] = '\0';
    local_108.buf[9] = '\0';
    local_108.buf[10] = '\0';
    local_108.buf[0xb] = '\0';
    local_108.buf[0xc] = '\0';
    local_108.buf[0xd] = '\0';
    local_108.buf[0xe] = '\0';
    local_108.buf[0xf] = '\0';
    local_108.s[4] = 0;
    local_108.s[5] = 0;
    local_108.s[6] = 0;
    local_108.s[7] = 0;
    local_108.s[0] = 0;
    local_108.s[1] = 0;
    local_108.s[2] = 0;
    local_108.s[3] = 0;
    local_108.bytes = 0;
    local_14a = (char)lVar7 + '\x02';
    k = k + 1;
    lVar7 = lVar7 + 1;
  } while (lVar7 == 0);
  return;
}

Assistant:

static void secp256k1_nonce_function_musig(secp256k1_scalar *k, const unsigned char *session_secrand, const unsigned char *msg32, const unsigned char *seckey32, const unsigned char *pk33, const unsigned char *agg_pk32, const unsigned char *extra_input32) {
    secp256k1_sha256 sha;
    unsigned char rand[32];
    unsigned char i;
    unsigned char msg_present;

    if (seckey32 != NULL) {
        secp256k1_nonce_function_musig_sha256_tagged_aux(&sha);
        secp256k1_sha256_write(&sha, session_secrand, 32);
        secp256k1_sha256_finalize(&sha, rand);
        for (i = 0; i < 32; i++) {
            rand[i] ^= seckey32[i];
        }
    } else {
        memcpy(rand, session_secrand, sizeof(rand));
    }

    secp256k1_nonce_function_musig_sha256_tagged(&sha);
    secp256k1_sha256_write(&sha, rand, sizeof(rand));
    secp256k1_nonce_function_musig_helper(&sha, 1, pk33, 33);
    secp256k1_nonce_function_musig_helper(&sha, 1, agg_pk32, 32);
    msg_present = msg32 != NULL;
    secp256k1_sha256_write(&sha, &msg_present, 1);
    if (msg_present) {
        secp256k1_nonce_function_musig_helper(&sha, 8, msg32, 32);
    }
    secp256k1_nonce_function_musig_helper(&sha, 4, extra_input32, 32);

    for (i = 0; i < 2; i++) {
        unsigned char buf[32];
        secp256k1_sha256 sha_tmp = sha;
        secp256k1_sha256_write(&sha_tmp, &i, 1);
        secp256k1_sha256_finalize(&sha_tmp, buf);
        secp256k1_scalar_set_b32(&k[i], buf, NULL);

        /* Attempt to erase secret data */
        secp256k1_memclear(buf, sizeof(buf));
        secp256k1_sha256_clear(&sha_tmp);
    }
    secp256k1_memclear(rand, sizeof(rand));
    secp256k1_sha256_clear(&sha);
}